

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

int __thiscall
kj::CapabilityStreamNetworkAddress::connect
          (CapabilityStreamNetworkAddress *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  long *plVar1;
  undefined8 *puVar2;
  PromiseArena *pPVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  AsyncInputStream AVar7;
  _func_int **pp_Var8;
  PromiseArena *pPVar9;
  void *pvVar10;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  long lVar11;
  TransformPromiseNodeBase *this_00;
  CapabilityPipe pipe;
  undefined8 uStack_90;
  AsyncCapabilityStream local_88;
  undefined8 uStack_70;
  undefined8 local_68;
  PromiseArena *apPStack_60 [2];
  long *plStack_50;
  undefined8 *local_40;
  long *plStack_38;
  
  apPStack_60[1] = (PromiseArena *)0x0;
  plStack_50 = (long *)0x0;
  local_68 = (_func_int **)0x0;
  apPStack_60[0] = (PromiseArena *)0x0;
  plVar1 = *(long **)(CONCAT44(in_register_00000034,__fd) + 8);
  if (plVar1 == (long *)0x0) {
    uStack_90 = 0x486a29;
    newCapabilityPipe();
    lVar11 = 8;
    do {
      puVar2 = *(undefined8 **)((long)&uStack_70 + lVar11);
      plVar1 = *(long **)((long)&local_68 + lVar11);
      uVar4 = *(undefined4 *)((long)&uStack_90 + lVar11 + 4);
      uVar5 = *(undefined4 *)
               ((long)&local_88.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream +
               lVar11);
      uVar6 = *(undefined4 *)
               ((long)&local_88.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream +
               lVar11 + 4);
      *(undefined4 *)((long)&uStack_70 + lVar11) = *(undefined4 *)((long)&uStack_90 + lVar11);
      *(undefined4 *)((long)&uStack_70 + lVar11 + 4) = uVar4;
      *(undefined4 *)((long)&local_68 + lVar11) = uVar5;
      *(undefined4 *)((long)&local_68 + lVar11 + 4) = uVar6;
      *(undefined8 *)
       ((long)&local_88.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream + lVar11)
           = 0;
      if (plVar1 != (long *)0x0) {
        uStack_90 = 0x486a5e;
        (**(code **)*puVar2)(puVar2,(long)plVar1 + *(long *)(*plVar1 + -0x10));
      }
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x28);
    lVar11 = 0x10;
    do {
      plVar1 = *(long **)((long)&local_88.super_AsyncIoStream.super_AsyncOutputStream.
                                 _vptr_AsyncOutputStream + lVar11);
      if (plVar1 != (long *)0x0) {
        *(undefined8 *)
         ((long)&local_88.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream +
         lVar11) = 0;
        puVar2 = *(undefined8 **)
                  ((long)&local_88.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream
                  + lVar11);
        uStack_90 = 0x486a91;
        (**(code **)*puVar2)(puVar2,(long)plVar1 + *(long *)(*plVar1 + -0x10));
      }
      lVar11 = lVar11 + -0x10;
    } while (lVar11 != -0x10);
  }
  else {
    uStack_90 = 0x4869ad;
    (**(code **)(*plVar1 + 0x10))(&local_88,plVar1,__addr,CONCAT44(in_register_0000000c,__len));
    lVar11 = 8;
    do {
      puVar2 = *(undefined8 **)((long)&uStack_70 + lVar11);
      plVar1 = *(long **)((long)&local_68 + lVar11);
      uVar4 = *(undefined4 *)((long)&uStack_90 + lVar11 + 4);
      uVar5 = *(undefined4 *)
               ((long)&local_88.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream +
               lVar11);
      uVar6 = *(undefined4 *)
               ((long)&local_88.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream +
               lVar11 + 4);
      *(undefined4 *)((long)&uStack_70 + lVar11) = *(undefined4 *)((long)&uStack_90 + lVar11);
      *(undefined4 *)((long)&uStack_70 + lVar11 + 4) = uVar4;
      *(undefined4 *)((long)&local_68 + lVar11) = uVar5;
      *(undefined4 *)((long)&local_68 + lVar11 + 4) = uVar6;
      *(undefined8 *)
       ((long)&local_88.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream + lVar11)
           = 0;
      if (plVar1 != (long *)0x0) {
        uStack_90 = 0x4869e2;
        (**(code **)*puVar2)(puVar2,(long)plVar1 + *(long *)(*plVar1 + -0x10));
      }
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x28);
    lVar11 = 0x10;
    do {
      plVar1 = *(long **)((long)&local_88.super_AsyncIoStream.super_AsyncOutputStream.
                                 _vptr_AsyncOutputStream + lVar11);
      if (plVar1 != (long *)0x0) {
        *(undefined8 *)
         ((long)&local_88.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream +
         lVar11) = 0;
        puVar2 = *(undefined8 **)
                  ((long)&local_88.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream
                  + lVar11);
        uStack_90 = 0x486a15;
        (**(code **)*puVar2)(puVar2,(long)plVar1 + *(long *)(*plVar1 + -0x10));
      }
      lVar11 = lVar11 + -0x10;
    } while (lVar11 != -0x10);
  }
  pPVar9 = apPStack_60[0];
  pp_Var8 = local_68;
  apPStack_60[0] = (PromiseArena *)0x0;
  local_40 = (undefined8 *)apPStack_60[1];
  plStack_38 = plStack_50;
  plStack_50 = (long *)0x0;
  uStack_90 = 0x486aca;
  AsyncCapabilityStream::sendStream
            (&local_88,
             *(Own<kj::AsyncCapabilityStream,_std::nullptr_t> **)
              (CONCAT44(in_register_00000034,__fd) + 0x10));
  AVar7._vptr_AsyncInputStream =
       local_88.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream;
  pPVar3 = (PromiseArena *)
           local_88.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[1];
  if (pPVar3 == (PromiseArena *)0x0 ||
      (ulong)((long)local_88.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream -
             (long)pPVar3) < 0x30) {
    uStack_90 = 0x486af3;
    pvVar10 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar10 + 0x3d0);
    uStack_90 = 0x486b0f;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_88,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2789:13)>
               ::anon_class_16_1_6971b95b_for_func::operator());
    *(undefined ***)((long)pvVar10 + 0x3d0) = &PTR_destroy_0070cbe8;
    *(_func_int ***)((long)pvVar10 + 0x3f0) = pp_Var8;
    *(PromiseArena **)((long)pvVar10 + 0x3f8) = pPVar9;
    *(void **)((long)pvVar10 + 0x3d8) = pvVar10;
  }
  else {
    local_88.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[1] = (_func_int *)0x0
    ;
    this_00 = (TransformPromiseNodeBase *)
              (local_88.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream + -6);
    uStack_90 = 0x486b52;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_88,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2789:13)>
               ::anon_class_16_1_6971b95b_for_func::operator());
    ((PromiseArenaMember *)(AVar7._vptr_AsyncInputStream + -6))->_vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_0070cbe8;
    ((PromiseArenaMember *)(AVar7._vptr_AsyncInputStream + -2))->_vptr_PromiseArenaMember = pp_Var8;
    AVar7._vptr_AsyncInputStream[-1] = (_func_int *)pPVar9;
    AVar7._vptr_AsyncInputStream[-5] = (_func_int *)pPVar3;
  }
  AVar7._vptr_AsyncInputStream =
       local_88.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream;
  (this->super_NetworkAddress)._vptr_NetworkAddress = (_func_int **)this_00;
  if ((PromiseArenaMember *)
      local_88.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream !=
      (PromiseArenaMember *)0x0) {
    local_88.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
    uStack_90 = 0x486b85;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar7._vptr_AsyncInputStream);
  }
  plVar1 = plStack_38;
  if (plStack_38 != (long *)0x0) {
    plStack_38 = (long *)0x0;
    uStack_90 = 0x486ba9;
    (**(code **)*local_40)(local_40,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  lVar11 = 0x10;
  do {
    plVar1 = *(long **)((long)apPStack_60 + lVar11);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)apPStack_60 + lVar11) = 0;
      uStack_90 = 0x486bd3;
      (**(code **)**(undefined8 **)((long)&local_68 + lVar11))
                (*(undefined8 **)((long)&local_68 + lVar11),
                 (long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    lVar11 = lVar11 + -0x10;
  } while (lVar11 != -0x10);
  return (int)this;
}

Assistant:

Promise<Own<AsyncIoStream>> CapabilityStreamNetworkAddress::connect() {
  CapabilityPipe pipe;
  KJ_IF_SOME(p, provider) {
    pipe = p.newCapabilityPipe();
  } else {
    pipe = kj::newCapabilityPipe();
  }